

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogFinish(void)

{
  ImGuiContext *pIVar1;
  char *text;
  
  pIVar1 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    switch(pIVar1->LogType) {
    case ImGuiLogType_None:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2f77,"void ImGui::LogFinish()");
    case ImGuiLogType_TTY:
      fflush((FILE *)pIVar1->LogFile);
      break;
    case ImGuiLogType_File:
      ImFileClose(pIVar1->LogFile);
      break;
    case ImGuiLogType_Clipboard:
      if (1 < (pIVar1->LogBuffer).Buf.Size) {
        text = ImGuiTextBuffer::begin(&pIVar1->LogBuffer);
        SetClipboardText(text);
      }
    }
    pIVar1->LogEnabled = false;
    pIVar1->LogType = ImGuiLogType_None;
    pIVar1->LogFile = (ImFileHandle)0x0;
    ImVector<char>::clear(&(pIVar1->LogBuffer).Buf);
    return;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        fflush(g.LogFile);
#endif
        break;
    case ImGuiLogType_File:
        ImFileClose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}